

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O2

int OBJ_ln2nid(char *s)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  ushort *puVar3;
  ASN1_OBJECT templ;
  
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if ((global_added_by_long_name != (lhash_st_ASN1_OBJECT *)0x0) &&
     (templ.ln = s, pAVar2 = lh_ASN1_OBJECT_retrieve(global_added_by_long_name,&templ),
     pAVar2 != (ASN1_OBJECT *)0x0)) {
    CRYPTO_MUTEX_unlock_read(&global_added_lock);
    return pAVar2->nid;
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);
  puVar3 = (ushort *)bsearch(s,kNIDsInLongNameOrder,0x3ba,2,long_name_cmp);
  if (puVar3 == (ushort *)0x0) {
    iVar1 = 0;
  }
  else {
    pAVar2 = get_builtin_object((uint)*puVar3);
    iVar1 = pAVar2->nid;
  }
  return iVar1;
}

Assistant:

int OBJ_ln2nid(const char *long_name) {
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_long_name != NULL) {
    ASN1_OBJECT *match, templ;

    templ.ln = long_name;
    match = lh_ASN1_OBJECT_retrieve(global_added_by_long_name, &templ);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(bsearch(
      long_name, kNIDsInLongNameOrder, OPENSSL_ARRAY_SIZE(kNIDsInLongNameOrder),
      sizeof(kNIDsInLongNameOrder[0]), long_name_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}